

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

void __thiscall google::protobuf::io::CodedInputStream::PopLimit(CodedInputStream *this,Limit limit)

{
  uint8_t *puVar1;
  int iVar2;
  int iVar3;
  
  this->current_limit_ = limit;
  puVar1 = this->buffer_end_;
  this->buffer_end_ = puVar1 + this->buffer_size_after_limit_;
  if (this->total_bytes_limit_ < limit) {
    limit = this->total_bytes_limit_;
  }
  iVar2 = this->total_bytes_read_ - limit;
  iVar3 = 0;
  if (iVar2 != 0 && limit <= this->total_bytes_read_) {
    this->buffer_end_ = puVar1 + this->buffer_size_after_limit_ + -(long)iVar2;
    iVar3 = iVar2;
  }
  this->buffer_size_after_limit_ = iVar3;
  this->legitimate_message_end_ = false;
  return;
}

Assistant:

void CodedInputStream::PopLimit(Limit limit) {
  // The limit passed in is actually the *old* limit, which we returned from
  // PushLimit().
  current_limit_ = limit;
  RecomputeBufferLimits();

  // We may no longer be at a legitimate message end.  ReadTag() needs to be
  // called again to find out.
  legitimate_message_end_ = false;
}